

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_1::ToAll
                   (string *__return_storage_ptr__,string *input,function<char_(char)> *transform)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  undefined8 local_30;
  size_t i;
  function<char_(char)> *transform_local;
  string *input_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_30 = 0; uVar2 = std::__cxx11::string::length(), local_30 < uVar2;
      local_30 = local_30 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
    cVar1 = std::function<char_(char)>::operator()(transform,*pcVar3);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToAll(const std::string &input,
                  std::function<char(const char)> transform) {
  std::string s;
  for (size_t i = 0; i < input.length(); i++) { s += transform(input[i]); }
  return s;
}